

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlFeatureDefn::DebugXmlFeatures(GdlFeatureDefn *this,ofstream *strmOut,string *staPathToCur)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  GdlFeatureSetting *this_00;
  bool bVar4;
  ostream *poVar5;
  size_t sVar6;
  pointer ppGVar7;
  ulong uVar8;
  ulong uVar9;
  string staT;
  char rgch [5];
  GrpLineAndFile lnf;
  string local_c8;
  char local_a5 [4];
  undefined1 local_a1;
  string *local_a0;
  string local_98;
  string local_78;
  GrpLineAndFile local_58;
  
  local_a0 = staPathToCur;
  GrpLineAndFile::GrpLineAndFile(&local_58,&(this->super_GdlDefn).super_GdlObject.m_lnf);
  uVar2 = this->m_nID;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"    <feature name=\"",0x13)
  ;
  paVar1 = &local_c8.field_2;
  pcVar3 = (this->m_staName)._M_dataplus._M_p;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,pcVar3 + (this->m_staName)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)strmOut,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" featureID=\"",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (0xffffff < uVar2) {
    local_a1 = 0;
    local_a5[3] = (char)uVar2;
    local_a5[2] = (char)(uVar2 >> 8);
    local_a5[1] = (char)(uVar2 >> 0x10);
    local_a5[0] = (char)(uVar2 >> 0x18);
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(local_a5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,local_a5,local_a5 + sVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)strmOut,"\" featureIDstring=\"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)strmOut,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" index=\"",9);
  std::ostream::operator<<(strmOut,this->m_nInternalID);
  if ((local_58.m_nLinePre != -1) && (this->m_nID != 1)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" inFile=\"",10);
    pcVar3 = (local_a0->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,pcVar3 + local_a0->_M_string_length);
    GrpLineAndFile::FileWithPath(&local_c8,&local_58,&local_78);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)strmOut,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" atLine=\"",10);
    std::ostream::operator<<(poVar5,local_58.m_nLineOrig);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" >\n",4);
  ppGVar7 = (this->m_vpfset).
            super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_vpfset).super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppGVar7) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      this_00 = ppGVar7[uVar8];
      pcVar3 = (local_a0->_M_dataplus)._M_p;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar3,pcVar3 + local_a0->_M_string_length);
      GdlFeatureSetting::DebugXmlFeatures(this_00,strmOut,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      ppGVar7 = (this->m_vpfset).
                super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar9 < (ulong)((long)(this->m_vpfset).
                                    super__Vector_base<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar7 >> 3)
      ;
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"    </feature>\n",0xf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_staFile._M_dataplus._M_p != &local_58.m_staFile.field_2) {
    operator_delete(local_58.m_staFile._M_dataplus._M_p,
                    local_58.m_staFile.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GdlFeatureDefn::DebugXmlFeatures(std::ofstream & strmOut, std::string staPathToCur)
{
	GrpLineAndFile lnf = this->LineAndFile();
	unsigned int nID = this->ID();
	strmOut << "    <feature name=\"" << this->Name()
		<< "\" featureID=\"" << nID;
	if (nID > 0xFFFFFF)
	{
		// Output string format as well.

		char rgch[5];
		rgch[4] = 0;
		rgch[3] = (char)(nID & 0x000000FF);
		rgch[2] = (char)((nID & 0x0000FF00) >> 8);
		rgch[1] = (char)((nID & 0x00FF0000) >> 16);
		rgch[0] = (char)((nID & 0xFF000000) >> 24);
		std::string staT(rgch);

		// Why doesn't this work??
		//union {
		//	char rgch[4];
		//	unsigned int n;
		//} featid;
		//featid.n = nID;
		//// Reverse them.
		//char chTmp = featid.rgch[0];
		//featid.rgch[0] = featid.rgch[4];
		//featid.rgch[4] = chTmp;
		//chTmp = featid.rgch[2];
		//featid.rgch[2] = featid.rgch[3];
		//featid.rgch[3] = chTmp;
		//std::string staT(featid.rgch);
		
		strmOut << "\" featureIDstring=\"" << staT;
	}
	strmOut << "\" index=\"" << this->InternalID();

	if (!lnf.NotSet() && this->ID() != kfidStdLang)
		strmOut << "\" inFile=\"" << lnf.FileWithPath(staPathToCur)
			<< "\" atLine=\"" << lnf.OriginalLine();

	strmOut << "\" >\n";

	for (unsigned int ifset = 0; ifset < m_vpfset.size(); ifset++)
	{
		m_vpfset[ifset]->DebugXmlFeatures(strmOut, staPathToCur);
	}

	strmOut << "    </feature>\n";
}